

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparsehashtable.h
# Opt level: O3

iterator * __thiscall
google::
sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
::begin(iterator *__return_storage_ptr__,
       sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
       *this)

{
  pointer psVar1;
  pointer psVar2;
  pointer psVar3;
  pointer psVar4;
  pointer piVar5;
  
  psVar1 = (this->table).groups.
           super__Vector_base<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar2 = (this->table).groups.
           super__Vector_base<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  psVar4 = psVar1;
  if (psVar1 == psVar2) {
    piVar5 = (pointer)0x0;
  }
  else {
    piVar5 = psVar1->group;
    if (((psVar1->settings).num_buckets == 0) && (psVar4 = psVar1 + 1, psVar4 != psVar2)) {
      do {
        psVar3 = psVar4;
        psVar4 = psVar3;
        if ((psVar3->settings).num_buckets != 0) break;
        psVar4 = psVar3 + 1;
      } while (psVar4 != psVar2);
      piVar5 = psVar3->group;
    }
  }
  __return_storage_ptr__->ht = this;
  (__return_storage_ptr__->pos).row_begin._M_current = psVar1;
  (__return_storage_ptr__->pos).row_end._M_current = psVar2;
  (__return_storage_ptr__->pos).row_current._M_current = psVar4;
  (__return_storage_ptr__->pos).col_current = piVar5;
  (__return_storage_ptr__->end).row_begin._M_current = psVar1;
  (__return_storage_ptr__->end).row_end._M_current = psVar2;
  (__return_storage_ptr__->end).row_current._M_current = psVar2;
  (__return_storage_ptr__->end).col_current = (nonempty_iterator)0x0;
  sparse_hashtable_iterator<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::advance_past_deleted(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

iterator begin() {
    return iterator(this, table.nonempty_begin(), table.nonempty_end());
  }